

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O2

void printwbmp(Wbmp *wbmp)

{
  int iVar1;
  int iVar2;
  
  for (iVar1 = 0; iVar1 < wbmp->height; iVar1 = iVar1 + 1) {
    for (iVar2 = 0; iVar2 < wbmp->width; iVar2 = iVar2 + 1) {
      putchar((uint)(wbmp->bitmap[wbmp->width * iVar1 + iVar2] == 0) * 3 + 0x20);
    }
    putchar(10);
  }
  return;
}

Assistant:

void printwbmp(Wbmp *wbmp)
{
	int row, col;

	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[wbmp->width * row + col] == WBMP_BLACK) {
				putchar('#');
			} else {
				putchar(' ');
			}
		}
		putchar('\n');
	}
}